

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O0

void __thiscall
QGraphicsAnchorLayoutPrivate::identifyFloatItems
          (QGraphicsAnchorLayoutPrivate *this,QSet<QtGraphicsAnchorLayout::AnchorData_*> *visited,
          Orientation orientation)

{
  bool bVar1;
  AnchorData **ppAVar2;
  const_iterator o;
  undefined4 in_EDX;
  AnchorData *in_RSI;
  QGraphicsAnchorLayoutPrivate *in_RDI;
  long in_FS_OFFSET;
  add_const_t<QList<QGraphicsLayoutItem_*>_> *__range1_1;
  AnchorData *ad;
  QSet<QtGraphicsAnchorLayout::AnchorData_*> *__range1;
  QGraphicsLayoutItem *item;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  QSet<QGraphicsLayoutItem_*> floatItems;
  const_iterator __end1;
  const_iterator __begin1;
  QSet<QGraphicsLayoutItem_*> nonFloating;
  const_iterator *in_stack_ffffffffffffff58;
  AnchorData *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff80;
  AnchorData *ad_00;
  QGraphicsAnchorLayoutPrivate *this_00;
  const_iterator local_40;
  QSet<QGraphicsLayoutItem_*> local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QSet<QGraphicsLayoutItem_*>::QSet((QSet<QGraphicsLayoutItem_*> *)0x9418c0);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  ad_00 = in_RSI;
  QSet<QtGraphicsAnchorLayout::AnchorData_*>::begin
            ((QSet<QtGraphicsAnchorLayout::AnchorData_*> *)in_RSI);
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  QSet<QtGraphicsAnchorLayout::AnchorData_*>::end
            ((QSet<QtGraphicsAnchorLayout::AnchorData_*> *)in_RSI);
  while( true ) {
    bVar1 = QSet<QtGraphicsAnchorLayout::AnchorData_*>::const_iterator::operator!=
                      ((const_iterator *)in_RDI,in_stack_ffffffffffffff58);
    if (!bVar1) break;
    ppAVar2 = QSet<QtGraphicsAnchorLayout::AnchorData_*>::const_iterator::operator*
                        ((const_iterator *)0x941958);
    in_stack_ffffffffffffff70 = *ppAVar2;
    identifyNonFloatItems_helper
              (this_00,ad_00,
               (QSet<QGraphicsLayoutItem_*> *)CONCAT44(in_EDX,in_stack_ffffffffffffff80));
    QSet<QtGraphicsAnchorLayout::AnchorData_*>::const_iterator::operator++((const_iterator *)in_RDI)
    ;
  }
  local_38.q_hash.d = (Hash)&DAT_aaaaaaaaaaaaaaaa;
  QSet<QGraphicsLayoutItem_*>::QSet((QSet<QGraphicsLayoutItem_*> *)0x94199c);
  local_40.i = (QGraphicsLayoutItem **)&DAT_aaaaaaaaaaaaaaaa;
  local_40 = QList<QGraphicsLayoutItem_*>::begin((QList<QGraphicsLayoutItem_*> *)in_RDI);
  o = QList<QGraphicsLayoutItem_*>::end((QList<QGraphicsLayoutItem_*> *)in_RDI);
  while( true ) {
    bVar1 = QList<QGraphicsLayoutItem_*>::const_iterator::operator!=(&local_40,o);
    if (!bVar1) break;
    QList<QGraphicsLayoutItem_*>::const_iterator::operator*(&local_40);
    bVar1 = QSet<QGraphicsLayoutItem_*>::contains
                      ((QSet<QGraphicsLayoutItem_*> *)in_RDI,
                       (QGraphicsLayoutItem **)in_stack_ffffffffffffff58);
    if (!bVar1) {
      QSet<QGraphicsLayoutItem_*>::insert
                ((QSet<QGraphicsLayoutItem_*> *)in_RSI,
                 (QGraphicsLayoutItem **)in_stack_ffffffffffffff70);
    }
    QList<QGraphicsLayoutItem_*>::const_iterator::operator++(&local_40);
  }
  QHVContainer<QSet<QGraphicsLayoutItem_*>_>::operator[]
            ((QHVContainer<QSet<QGraphicsLayoutItem_*>_> *)in_RDI,
             (Orientation)((ulong)in_stack_ffffffffffffff58 >> 0x20));
  QSet<QGraphicsLayoutItem_*>::operator=((QSet<QGraphicsLayoutItem_*> *)in_RDI,&local_38);
  QSet<QGraphicsLayoutItem_*>::~QSet((QSet<QGraphicsLayoutItem_*> *)0x941a89);
  QSet<QGraphicsLayoutItem_*>::~QSet((QSet<QGraphicsLayoutItem_*> *)0x941a96);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsAnchorLayoutPrivate::identifyFloatItems(const QSet<AnchorData *> &visited, Qt::Orientation orientation)
{
    QSet<QGraphicsLayoutItem *> nonFloating;

    for (const AnchorData *ad : visited)
        identifyNonFloatItems_helper(ad, &nonFloating);

    QSet<QGraphicsLayoutItem *> floatItems;
    for (QGraphicsLayoutItem *item : std::as_const(items)) {
        if (!nonFloating.contains(item))
            floatItems.insert(item);
    }
    m_floatItems[orientation] = std::move(floatItems);
}